

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

int __thiscall Fl_Browser_::handle(Fl_Browser_ *this,int event)

{
  void *pvVar1;
  bool bVar2;
  byte bVar3;
  uchar uVar4;
  int iVar5;
  Fl_When FVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  void *pvVar11;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  fd_set *in_R8;
  fd_set *__exceptfds;
  timeval *in_R9;
  void *local_310;
  void *local_2d0;
  void *local_2c0;
  uint local_1b0;
  uint local_180;
  void *t_1;
  void *l_3;
  void *l1_1;
  void *pvStack_c0;
  char change_t;
  void *b;
  void *t;
  void *l_2;
  int local_a0;
  int hh;
  int p_1;
  int p;
  void *m_2;
  void *e;
  void *m_1;
  void *m;
  int down;
  void *l_1;
  undefined1 local_60 [4];
  int my;
  int H;
  int W;
  int Y;
  int X;
  void *l;
  void *l1;
  undefined4 local_2c;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  int event_local;
  Fl_Browser_ *this_local;
  
  wp.wp_._4_4_ = event;
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
  if ((wp.wp_._4_4_ == 3) || (wp.wp_._4_4_ == 4)) {
    this_local._4_4_ = 1;
    goto LAB_00218c00;
  }
  if ((wp.wp_._4_4_ == 8) && (bVar3 = Fl_Widget::type((Fl_Widget *)this), 1 < bVar3)) {
    l = this->selection_;
    _Y = l;
    if (l == (void *)0x0) {
      _Y = this->top_;
    }
    if (_Y == (void *)0x0) {
      iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
      _Y = (void *)CONCAT44(extraout_var,iVar5);
    }
    if (_Y != (void *)0x0) {
      uVar4 = Fl_Widget::type((Fl_Widget *)this);
      if (uVar4 != '\x02') {
        iVar5 = Fl::event_key();
        pvVar11 = _Y;
        if (iVar5 == 0x20) {
          this->selection_ = _Y;
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])();
          FVar6 = Fl_Widget::when((Fl_Widget *)this);
          select(this,(int)pvVar11,(fd_set *)(ulong)(iVar5 == 0),
                 (fd_set *)(ulong)(FVar6 & ~FL_WHEN_ENTER_KEY),in_R8,in_R9);
          this_local._4_4_ = 1;
          goto LAB_00218c00;
        }
        if (iVar5 == 0xff0d) {
LAB_002177a4:
          FVar6 = Fl_Widget::when((Fl_Widget *)this);
          select_only(this,pvVar11,FVar6 & ~FL_WHEN_ENTER_KEY);
          iVar5 = Fl_Widget_Tracker::deleted(&local_28);
          if (iVar5 == 0) {
            FVar6 = Fl_Widget::when((Fl_Widget *)this);
            if ((FVar6 & FL_WHEN_ENTER_KEY) != FL_WHEN_NEVER) {
              Fl_Widget::set_changed((Fl_Widget *)this);
              Fl_Widget::do_callback((Fl_Widget *)this);
            }
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          if (iVar5 == 0xff52) {
            do {
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,_Y);
              _Y = (void *)CONCAT44(extraout_var_03,iVar5);
              if (_Y == (void *)0x0) {
                this_local._4_4_ = 1;
                goto LAB_00218c00;
              }
              iVar5 = Fl::event_state(0x50000);
              pvVar11 = _Y;
              if (iVar5 != 0) {
                if (l == (void *)0x0) {
                  local_1b0 = 1;
                }
                else {
                  local_1b0 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])
                                        (this,l);
                }
                FVar6 = Fl_Widget::when((Fl_Widget *)this);
                select(this,(int)pvVar11,(fd_set *)(ulong)local_1b0,(fd_set *)(ulong)FVar6,in_R8,
                       in_R9);
              }
              iVar5 = Fl_Widget_Tracker::deleted(&local_28);
              if (iVar5 != 0) {
                this_local._4_4_ = 1;
                goto LAB_00218c00;
              }
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,_Y);
            } while (iVar5 < 1);
          }
          else {
            if (iVar5 != 0xff54) {
              if (iVar5 != 0xff8d) goto LAB_00217c0e;
              goto LAB_002177a4;
            }
            do {
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,_Y);
              _Y = (void *)CONCAT44(extraout_var_02,iVar5);
              if (_Y == (void *)0x0) {
                this_local._4_4_ = 1;
                goto LAB_00218c00;
              }
              iVar5 = Fl::event_state(0x50000);
              pvVar11 = _Y;
              if (iVar5 != 0) {
                if (l == (void *)0x0) {
                  local_180 = 1;
                }
                else {
                  local_180 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])
                                        (this,l);
                }
                FVar6 = Fl_Widget::when((Fl_Widget *)this);
                select(this,(int)pvVar11,(fd_set *)(ulong)local_180,(fd_set *)(ulong)FVar6,in_R8,
                       in_R9);
              }
              iVar5 = Fl_Widget_Tracker::deleted(&local_28);
              if (iVar5 != 0) {
                this_local._4_4_ = 1;
                goto LAB_00218c00;
              }
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,_Y);
            } while (iVar5 < 1);
          }
          if (this->selection_ != (void *)0x0) {
            redraw_line(this,this->selection_);
          }
          this->selection_ = _Y;
          redraw_line(this,_Y);
          display(this,_Y);
          this_local._4_4_ = 1;
        }
        goto LAB_00218c00;
      }
      iVar5 = Fl::event_key();
      if (iVar5 == 0xff52) {
        do {
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,_Y);
          _Y = (void *)CONCAT44(extraout_var_01,iVar5);
          if (_Y == (void *)0x0) goto LAB_00217726;
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,_Y);
          pvVar11 = _Y;
        } while (iVar5 < 1);
        FVar6 = Fl_Widget::when((Fl_Widget *)this);
        select_only(this,pvVar11,FVar6);
LAB_00217726:
        this_local._4_4_ = 1;
        goto LAB_00218c00;
      }
      if (iVar5 == 0xff54) {
        do {
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,_Y);
          _Y = (void *)CONCAT44(extraout_var_00,iVar5);
          if (_Y == (void *)0x0) goto LAB_0021767b;
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,_Y);
          pvVar11 = _Y;
        } while (iVar5 < 1);
        FVar6 = Fl_Widget::when((Fl_Widget *)this);
        select_only(this,pvVar11,FVar6);
LAB_0021767b:
        this_local._4_4_ = 1;
        goto LAB_00218c00;
      }
    }
  }
LAB_00217c0e:
  iVar5 = Fl_Group::handle(&this->super_Fl_Group,wp.wp_._4_4_);
  if (iVar5 != 0) {
    this_local._4_4_ = 1;
    goto LAB_00218c00;
  }
  iVar5 = Fl_Widget_Tracker::deleted(&local_28);
  if (iVar5 != 0) {
    this_local._4_4_ = 1;
    goto LAB_00218c00;
  }
  __exceptfds = (fd_set *)local_60;
  bbox(this,&W,&H,&my,(int *)__exceptfds);
  switch(wp.wp_._4_4_) {
  case 1:
    iVar5 = Fl::event_inside(W,H,my,(int)local_60);
    if (iVar5 == 0) {
      this_local._4_4_ = 0;
      break;
    }
    iVar5 = Fl::visible_focus();
    if (iVar5 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    iVar5 = Fl::event_y();
    handle::change = '\0';
    handle::py = iVar5;
    uVar4 = Fl_Widget::type((Fl_Widget *)this);
    if ((uVar4 != '\0') && (this->top_ != (void *)0x0)) {
      uVar4 = Fl_Widget::type((Fl_Widget *)this);
      if (uVar4 == '\x03') {
        pvVar11 = find_item(this,iVar5);
        handle::whichway = '\x01';
        iVar5 = Fl::event_state(0x40000);
        if (iVar5 == 0) {
          iVar5 = Fl::event_state(0x10000);
          if (iVar5 == 0) {
            iVar5 = select_only(this,pvVar11,0);
            handle::change = (char)iVar5;
            iVar5 = Fl_Widget_Tracker::deleted(&local_28);
            if (iVar5 != 0) {
              this_local._4_4_ = 1;
              break;
            }
            if ((handle::change != '\0') &&
               (FVar6 = Fl_Widget::when((Fl_Widget *)this),
               (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER)) {
              Fl_Widget::set_changed((Fl_Widget *)this);
              Fl_Widget::do_callback((Fl_Widget *)this);
              iVar5 = Fl_Widget_Tracker::deleted(&local_28);
              if (iVar5 != 0) {
                this_local._4_4_ = 1;
                break;
              }
            }
          }
          else {
            if (pvVar11 == this->selection_) goto LAB_00217ee6;
            if (pvVar11 == (void *)0x0) {
              handle::whichway = '\x01';
              bVar2 = true;
            }
            else {
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar11);
              handle::whichway = (iVar5 != 0 ^ 0xffU) & 1;
              m_1 = this->selection_;
              while (m_1 != pvVar11) {
                if (m_1 == (void *)0x0) {
                  bVar2 = false;
                  goto LAB_00218101;
                }
                iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,m_1);
                m_1 = (void *)CONCAT44(extraout_var_04,iVar5);
              }
              bVar2 = true;
            }
LAB_00218101:
            if (bVar2) {
              e = this->selection_;
              while (e != pvVar11) {
                uVar7 = (uint)handle::whichway;
                FVar6 = Fl_Widget::when((Fl_Widget *)this);
                select(this,(int)e,(fd_set *)(ulong)uVar7,(fd_set *)(ulong)(FVar6 & FL_WHEN_CHANGED)
                       ,__exceptfds,in_R9);
                iVar5 = Fl_Widget_Tracker::deleted(&local_28);
                if (iVar5 != 0) {
                  this_local._4_4_ = 1;
                  goto LAB_00218c00;
                }
                iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,e);
                e = (void *)CONCAT44(extraout_var_05,iVar5);
              }
            }
            else {
              pvVar1 = this->selection_;
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar11);
              _p_1 = (void *)CONCAT44(extraout_var_06,iVar5);
              while (_p_1 != (void *)0x0) {
                uVar7 = (uint)handle::whichway;
                FVar6 = Fl_Widget::when((Fl_Widget *)this);
                select(this,(int)_p_1,(fd_set *)(ulong)uVar7,
                       (fd_set *)(ulong)(FVar6 & FL_WHEN_CHANGED),__exceptfds,in_R9);
                iVar5 = Fl_Widget_Tracker::deleted(&local_28);
                if (iVar5 != 0) {
                  this_local._4_4_ = 1;
                  goto LAB_00218c00;
                }
                if (_p_1 == pvVar1) break;
                iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,_p_1);
                _p_1 = (void *)CONCAT44(extraout_var_07,iVar5);
              }
            }
            handle::change = '\x01';
            if (pvVar11 != (void *)0x0) {
              uVar7 = (uint)handle::whichway;
              FVar6 = Fl_Widget::when((Fl_Widget *)this);
              select(this,(int)pvVar11,(fd_set *)(ulong)uVar7,
                     (fd_set *)(ulong)(FVar6 & FL_WHEN_CHANGED),__exceptfds,in_R9);
            }
            iVar5 = Fl_Widget_Tracker::deleted(&local_28);
            if (iVar5 != 0) {
              this_local._4_4_ = 1;
              break;
            }
          }
        }
        else {
LAB_00217ee6:
          if (pvVar11 != (void *)0x0) {
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar11);
            handle::whichway = iVar5 == 0;
            iVar5 = select(this,(int)pvVar11,(fd_set *)(ulong)(uint)(int)handle::whichway,
                           (fd_set *)0x0,__exceptfds,in_R9);
            handle::change = (char)iVar5;
            iVar5 = Fl_Widget_Tracker::deleted(&local_28);
            if (iVar5 != 0) {
              this_local._4_4_ = 1;
              break;
            }
            if ((handle::change != '\0') &&
               (FVar6 = Fl_Widget::when((Fl_Widget *)this),
               (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER)) {
              Fl_Widget::set_changed((Fl_Widget *)this);
              Fl_Widget::do_callback((Fl_Widget *)this);
              iVar5 = Fl_Widget_Tracker::deleted(&local_28);
              if (iVar5 != 0) {
                this_local._4_4_ = 1;
                break;
              }
            }
          }
        }
      }
      else {
        pvVar11 = find_item(this,iVar5);
        iVar5 = select_only(this,pvVar11,0);
        handle::change = (char)iVar5;
        iVar5 = Fl_Widget_Tracker::deleted(&local_28);
        if (iVar5 != 0) {
          this_local._4_4_ = 1;
          break;
        }
        if ((handle::change != '\0') &&
           (FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER))
        {
          Fl_Widget::set_changed((Fl_Widget *)this);
          Fl_Widget::do_callback((Fl_Widget *)this);
          iVar5 = Fl_Widget_Tracker::deleted(&local_28);
          if (iVar5 != 0) {
            this_local._4_4_ = 1;
            break;
          }
        }
      }
    }
    this_local._4_4_ = 1;
    break;
  case 2:
    uVar4 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar4 == '\x01') {
      pvVar11 = this->selection_;
      deselect(this,0);
      iVar5 = Fl_Widget_Tracker::deleted(&local_28);
      if (iVar5 != 0) {
        this_local._4_4_ = 1;
        break;
      }
      this->selection_ = pvVar11;
    }
    if (handle::change == '\0') {
      FVar6 = Fl_Widget::when((Fl_Widget *)this);
      if ((FVar6 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
    }
    else {
      Fl_Widget::set_changed((Fl_Widget *)this);
      FVar6 = Fl_Widget::when((Fl_Widget *)this);
      if ((FVar6 & FL_WHEN_RELEASE) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
    }
    iVar5 = Fl_Widget_Tracker::deleted(&local_28);
    if (iVar5 == 0) {
      iVar5 = Fl::event_clicks();
      if ((iVar5 != 0) &&
         (FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_ENTER_KEY) != FL_WHEN_NEVER))
      {
        Fl_Widget::set_changed((Fl_Widget *)this);
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case 5:
    iVar5 = Fl::event_y();
    if ((iVar5 < H) && (iVar5 < handle::py)) {
      hh = (this->real_position_ + iVar5) - H;
      if (hh < 0) {
        hh = 0;
      }
      position(this,hh);
    }
    else if ((H + (int)local_60 < iVar5) && (handle::py < iVar5)) {
      local_a0 = (this->real_position_ + iVar5) - (H + (int)local_60);
      iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])();
      if (iVar8 - (int)local_60 < local_a0) {
        local_a0 = iVar8 - (int)local_60;
      }
      if (local_a0 < 0) {
        local_a0 = 0;
      }
      position(this,local_a0);
    }
    uVar4 = Fl_Widget::type((Fl_Widget *)this);
    if ((uVar4 != '\0') && (this->top_ != (void *)0x0)) {
      uVar4 = Fl_Widget::type((Fl_Widget *)this);
      if (uVar4 == '\x03') {
        pvVar11 = find_item(this,iVar5);
        if (handle::py < iVar5) {
          if (this->selection_ == (void *)0x0) {
            local_2c0 = (void *)0x0;
          }
          else {
            iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])
                              (this,this->selection_);
            local_2c0 = (void *)CONCAT44(extraout_var_08,iVar8);
          }
          b = local_2c0;
          if (pvVar11 == (void *)0x0) {
            local_2d0 = (void *)0x0;
          }
          else {
            iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar11);
            local_2d0 = (void *)CONCAT44(extraout_var_09,iVar8);
          }
          pvStack_c0 = local_2d0;
        }
        else {
          pvStack_c0 = this->selection_;
          b = pvVar11;
        }
        while (b != (void *)0x0 && b != pvStack_c0) {
          iVar8 = select(this,(int)b,(fd_set *)(ulong)(uint)(int)handle::whichway,(fd_set *)0x0,
                         __exceptfds,in_R9);
          iVar9 = Fl_Widget_Tracker::deleted(&local_28);
          if (iVar9 != 0) {
            this_local._4_4_ = 1;
            goto LAB_00218c00;
          }
          handle::change = handle::change | (byte)iVar8;
          if (((byte)iVar8 != 0) &&
             (FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER
             )) {
            Fl_Widget::set_changed((Fl_Widget *)this);
            Fl_Widget::do_callback((Fl_Widget *)this);
            iVar8 = Fl_Widget_Tracker::deleted(&local_28);
            if (iVar8 != 0) {
              this_local._4_4_ = 1;
              goto LAB_00218c00;
            }
          }
          iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,b);
          b = (void *)CONCAT44(extraout_var_10,iVar8);
        }
        if (pvVar11 != (void *)0x0) {
          this->selection_ = pvVar11;
        }
      }
      else {
        pvVar11 = this->selection_;
        iVar8 = Fl::event_x();
        iVar9 = Fl_Widget::x((Fl_Widget *)this);
        if (iVar8 < iVar9) {
LAB_002188fc:
          local_310 = this->selection_;
        }
        else {
          iVar8 = Fl::event_x();
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::w((Fl_Widget *)this);
          if (iVar9 + iVar10 < iVar8) goto LAB_002188fc;
          local_310 = find_item(this,iVar5);
        }
        handle::change = local_310 != pvVar11;
        FVar6 = Fl_Widget::when((Fl_Widget *)this);
        select_only(this,local_310,FVar6 & FL_WHEN_CHANGED);
        iVar8 = Fl_Widget_Tracker::deleted(&local_28);
        if (iVar8 != 0) {
          this_local._4_4_ = 1;
          break;
        }
      }
    }
    this_local._4_4_ = 1;
    handle::py = iVar5;
    break;
  case 6:
  case 7:
    bVar3 = Fl_Widget::type((Fl_Widget *)this);
    if ((bVar3 < 2) || (iVar5 = Fl::visible_focus(), iVar5 == 0)) {
      this_local._4_4_ = 0;
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
  }
LAB_00218c00:
  local_2c = 1;
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
  return this_local._4_4_;
}

Assistant:

int Fl_Browser_::handle(int event) {

  // NOTE:
  // We use Fl_Widget_Tracker to test if the user has deleted
  // this widget in a callback. Callbacks can be called by:
  //  - do_callback()
  //  - select()
  //  - select_only()
  //  - deselect()
  // Thus we must test wp.deleted() after each of these calls,
  // unless we return directly after one of these.
  // If wp.deleted() is true, we return 1 because we used the event.

  Fl_Widget_Tracker wp(this);

  // must do shortcuts first or the scrollbar will get them...
  if (event == FL_ENTER || event == FL_LEAVE) return 1;
  if (event == FL_KEYBOARD && type() >= FL_HOLD_BROWSER) {
    void* l1 = selection_;
    void* l = l1; if (!l) l = top_; if (!l) l = item_first();
    if (l) {
      if (type()==FL_HOLD_BROWSER) {
        switch (Fl::event_key()) {
        case FL_Down:
	  while ((l = item_next(l))) {
	    if (item_height(l)>0) {select_only(l, when()); break;}
	  }
	  return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
	    if (item_height(l)>0) {
	      select_only(l, when());
	      break; // no need to test wp (return 1)
	    }
	  }
          return 1;
        } 
      } else  {
        switch (Fl::event_key()) {
        case FL_Enter:
        case FL_KP_Enter:
          select_only(l, when() & ~FL_WHEN_ENTER_KEY);
	  if (wp.deleted()) return 1;
	  if (when() & FL_WHEN_ENTER_KEY) {
	    set_changed();
	    do_callback();
	  }
          return 1;
        case ' ':
          selection_ = l;
          select(l, !item_selected(l), when() & ~FL_WHEN_ENTER_KEY);
          return 1;
        case FL_Down:
          while ((l = item_next(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
J1:
          if (selection_) redraw_line(selection_);
          selection_ = l; redraw_line(l);
          display(l);
          return 1;
        }
      }
    }
  }
  
  if (Fl_Group::handle(event)) return 1;
  if (wp.deleted()) return 1;

  int X, Y, W, H; bbox(X, Y, W, H);
  int my;
// NOTE:
// instead of:
//     change = select_only(find_item(my), when() & FL_WHEN_CHANGED)
// we use the construct:
//     change = select_only(find_item(my), 0);
//     if (change && (when() & FL_WHEN_CHANGED)) {
//	 set_changed();
//       do_callback();
//     }
// See str #834
// The first form calls the callback *before* setting change.
// The callback may execute an Fl::wait(), resulting in another
// call of Fl_Browser_::handle() for the same widget. The sequence
// of events can be an FL_PUSH followed by an FL_RELEASE.
// This second call of Fl_Browser_::handle() may result in a -
// somewhat unexpected - second concurrent invocation of the callback.

  static char change;
  static char whichway;
  static int py;
  switch (event) {
  case FL_PUSH:
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    if (Fl::visible_focus()) {
      Fl::focus(this);
      redraw();
    }
    my = py = Fl::event_y();
    change = 0;
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() != FL_MULTI_BROWSER) {
      change = select_only(find_item(my), 0);
      if (wp.deleted()) return 1;
      if (change && (when() & FL_WHEN_CHANGED)) {
	set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
    } else {
      void* l = find_item(my);
      whichway = 1;
      if (Fl::event_state(FL_COMMAND)) { // toggle selection:
      TOGGLE:
	if (l) {
	  whichway = !item_selected(l);
	  change = select(l, whichway, 0);
	  if (wp.deleted()) return 1;
	  if (change && (when() & FL_WHEN_CHANGED)) {
	    set_changed();
	    do_callback();
	    if (wp.deleted()) return 1;
	  }
	}
      } else if (Fl::event_state(FL_SHIFT)) { // extend selection:
	if (l == selection_) goto TOGGLE;
	// state of previous selection determines new value:
	whichway = l ? !item_selected(l) : 1;
	// see which of the new item or previous selection is earlier,
	// by searching from the previous forward for this one:
	int down;
	if (!l) down = 1;
	else {for (void* m = selection_; ; m = item_next(m)) {
	  if (m == l) {down = 1; break;}
	  if (!m) {down = 0; break;}
	}}
	if (down) {
	  for (void* m = selection_; m != l; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	  }
	} else {
	  void* e = selection_;
	  for (void* m = item_next(l); m; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	    if (m == e) break;
	  }
	}
	// do the clicked item last so the select box is around it:
	change = 1;
	if (l) select(l, whichway, when() & FL_WHEN_CHANGED);
	if (wp.deleted()) return 1;
      } else { // select only this item
	change = select_only(l, 0);
	if (wp.deleted()) return 1;
	if (change && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
    }
    return 1;
  case FL_DRAG:
    // do the scrolling first:
    my = Fl::event_y();
    if (my < Y && my < py) {
      int p = real_position_+my-Y;
      if (p<0) p = 0;
      position(p);
    } else if (my > (Y+H) && my > py) {
      int p = real_position_+my-(Y+H);
      int hh = full_height()-H; if (p > hh) p = hh;
      if (p<0) p = 0;
      position(p);
    }
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() == FL_MULTI_BROWSER) {
      void* l = find_item(my);
      void* t; void* b; // this will be the range to change
      if (my > py) { // go down
	t = selection_ ? item_next(selection_) : 0;
	b = l ? item_next(l) : 0;
      } else {	// go up
	t = l;
	b = selection_;
      }
      for (; t && t != b; t = item_next(t)) {
	char change_t;
	change_t = select(t, whichway, 0);
	if (wp.deleted()) return 1;
	change |= change_t;
	if (change_t && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
      if (l) selection_ = l;
    } else {
      void* l1 = selection_;
      void* l =
	(Fl::event_x()<x() || Fl::event_x()>x()+w()) ? selection_ :
	find_item(my);
      change = (l != l1);
      select_only(l, when() & FL_WHEN_CHANGED);
      if (wp.deleted()) return 1;
    }
    py = my;
    return 1;
  case FL_RELEASE:
    if (type() == FL_SELECT_BROWSER) {
      void* t = selection_;
      deselect();
      if (wp.deleted()) return 1;
      selection_ = t;
    }
    if (change) {
      set_changed();
      if (when() & FL_WHEN_RELEASE) do_callback();
    } else {
      if (when() & FL_WHEN_NOT_CHANGED) do_callback();
    }
    if (wp.deleted()) return 1;

    // double click calls the callback: (like Enter Key)
    if (Fl::event_clicks() && (when() & FL_WHEN_ENTER_KEY)) {
      set_changed();
      do_callback();
    }
    return 1;
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (type() >= FL_HOLD_BROWSER && Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  }

  return 0;
}